

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_compile_trailers(curl_slist *trailers,dynbuf *b,Curl_easy *handle)

{
  CURLcode CVar1;
  char *pcVar2;
  char *local_48;
  char *endofline_network;
  char *endofline_native;
  CURLcode result;
  char *ptr;
  Curl_easy *handle_local;
  dynbuf *b_local;
  curl_slist *trailers_local;
  
  b_local = (dynbuf *)trailers;
  if (((*(uint *)&(handle->state).field_0x74c >> 0xe & 1) == 0) &&
     ((*(ulong *)&(handle->set).field_0x8ba >> 4 & 1) == 0)) {
    endofline_network = "\r\n";
    local_48 = "\r\n";
  }
  else {
    endofline_network = "\n";
    local_48 = "\n";
  }
  do {
    if (b_local == (dynbuf *)0x0) {
      CVar1 = Curl_dyn_add(b,local_48);
      return CVar1;
    }
    pcVar2 = strchr(b_local->bufr,0x3a);
    if ((pcVar2 == (char *)0x0) || (pcVar2[1] != ' ')) {
      if ((handle != (Curl_easy *)0x0) && ((*(ulong *)&(handle->set).field_0x8ba >> 0x1c & 1) != 0))
      {
        Curl_infof(handle,"Malformatted trailing header, skipping trailer");
      }
    }
    else {
      CVar1 = Curl_dyn_add(b,b_local->bufr);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      CVar1 = Curl_dyn_add(b,endofline_network);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    b_local = (dynbuf *)b_local->leng;
  } while( true );
}

Assistant:

CURLcode Curl_http_compile_trailers(struct curl_slist *trailers,
                                    struct dynbuf *b,
                                    struct Curl_easy *handle)
{
  char *ptr = NULL;
  CURLcode result = CURLE_OK;
  const char *endofline_native = NULL;
  const char *endofline_network = NULL;

  if(
#ifdef CURL_DO_LINEEND_CONV
     (handle->state.prefer_ascii) ||
#endif
     (handle->set.crlf)) {
    /* \n will become \r\n later on */
    endofline_native  = "\n";
    endofline_network = "\x0a";
  }
  else {
    endofline_native  = "\r\n";
    endofline_network = "\x0d\x0a";
  }

  while(trailers) {
    /* only add correctly formatted trailers */
    ptr = strchr(trailers->data, ':');
    if(ptr && *(ptr + 1) == ' ') {
      result = Curl_dyn_add(b, trailers->data);
      if(result)
        return result;
      result = Curl_dyn_add(b, endofline_native);
      if(result)
        return result;
    }
    else
      infof(handle, "Malformatted trailing header, skipping trailer");
    trailers = trailers->next;
  }
  result = Curl_dyn_add(b, endofline_network);
  return result;
}